

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::ContainsKey(BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *this,uint *key)

{
  Type piVar1;
  uint uVar2;
  Type this_00;
  uint uVar3;
  
  piVar1 = this->buckets;
  uVar2 = 0;
  if (piVar1 != (Type)0x0) {
    uVar2 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar3 = piVar1[uVar2];
    uVar2 = 0;
    if (-1 < (int)uVar3) {
      uVar2 = 0;
      do {
        if (this->entries[uVar3].
            super_DefaultHashedEntry<unsigned_int,_Loop::InductionVariableChangeInfo,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<unsigned_int,_Loop::InductionVariableChangeInfo>.
            super_ValueEntry<Loop::InductionVariableChangeInfo,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Loop::InductionVariableChangeInfo>_>
            .super_KeyValueEntryDataLayout2<unsigned_int,_Loop::InductionVariableChangeInfo>.key ==
            *key) {
          this_00 = this->stats;
          goto LAB_003f12d1;
        }
        uVar2 = uVar2 + 1;
        uVar3 = this->entries[uVar3].
                super_DefaultHashedEntry<unsigned_int,_Loop::InductionVariableChangeInfo,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_Loop::InductionVariableChangeInfo>.
                super_ValueEntry<Loop::InductionVariableChangeInfo,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Loop::InductionVariableChangeInfo>_>
                .super_KeyValueEntryDataLayout2<unsigned_int,_Loop::InductionVariableChangeInfo>.
                next;
      } while (-1 < (int)uVar3);
    }
  }
  this_00 = this->stats;
  uVar3 = 0xffffffff;
LAB_003f12d1:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar2);
  }
  return -1 < (int)uVar3;
}

Assistant:

bool ContainsKey(const TKey& key) const
        {
            return FindEntry(key) >= 0;
        }